

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O0

int Gia_GlaCountNodes(Gia_Man_t *p,Vec_Int_t *vGla)

{
  int iVar1;
  bool bVar2;
  int local_28;
  int local_24;
  int Count;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vGla_local;
  Gia_Man_t *p_local;
  
  local_28 = 0;
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 < p->nObjs) {
      _Count = Gia_ManObj(p,local_24);
      bVar2 = _Count != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(_Count);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjId(p,_Count);
      iVar1 = Vec_IntEntry(vGla,iVar1);
      if (iVar1 != 0) {
        local_28 = local_28 + 1;
      }
    }
    local_24 = local_24 + 1;
  }
  return local_28;
}

Assistant:

int Gia_GlaCountNodes( Gia_Man_t * p, Vec_Int_t * vGla )
{
    Gia_Obj_t * pObj;
    int i, Count = 0;
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_IntEntry(vGla, Gia_ObjId(p, pObj)) )
            Count++;
    return Count;
}